

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignReader.cpp
# Opt level: O3

string * __thiscall
adios2::core::engine::CampaignReader::VariableExprStr_abi_cxx11_
          (string *__return_storage_ptr__,CampaignReader *this,VariableBase *Var)

{
  Engine *pEVar1;
  iterator iVar2;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_VarInternalInfo)._M_h,&Var->m_Name);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_true>
      ._M_cur == (__node_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pEVar1 = (this->m_Engines).
             super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>.
             _M_impl.super__Vector_impl_data._M_start
             [*(long *)((long)iVar2.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_true>
                              ._M_cur + 0x38)];
    (*pEVar1->_vptr_Engine[0xf])
              (__return_storage_ptr__,pEVar1,
               *(undefined8 *)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignReader::VarInternalInfo>,_true>
                       ._M_cur + 0x28));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CampaignReader::VariableExprStr(const VariableBase &Var)
{
    auto it = m_VarInternalInfo.find(Var.m_Name);
    if (it != m_VarInternalInfo.end())
    {
        VariableBase *vb = reinterpret_cast<VariableBase *>(it->second.originalVar);
        Engine *e = m_Engines[it->second.engineIdx];
        return e->VariableExprStr(*vb);
    }
    return "";
}